

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Book.cpp
# Opt level: O0

bool __thiscall BookChoose::loadBook(BookChoose *this)

{
  FILE *pFVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  uint uVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  int iVar8;
  uint uVar9;
  mapped_type local_338;
  mapped_type local_330;
  mapped_type local_328;
  mapped_type local_320;
  mapped_type local_318;
  mapped_type local_310;
  mapped_type local_308;
  mapped_type local_300;
  Position local_2f8;
  int local_2f0;
  int local_2ec;
  int col;
  int row;
  int j;
  bool hasGood;
  undefined1 local_2c4 [20];
  int white;
  int black;
  int I;
  char mov;
  char ch;
  BitBoard op;
  BitBoard my;
  Board tmpBoard;
  UCT local_235;
  int i;
  uint uStack_230;
  UCT uct;
  int bookSize;
  long local_220;
  ifstream in;
  BookChoose *this_local;
  
  _Var4 = std::operator|(_S_bin,_S_in);
  std::ifstream::ifstream(&local_220,"./book.bin",_Var4);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar2 & 1) != 0) {
    fprintf(_stderr,"cannot find Opening Book!\n");
  }
  std::istream::read((char *)&local_220,(long)&stack0xfffffffffffffdd0);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (((bVar2 & 1) == 0) && (0 < (int)uStack_230)) {
    fprintf(_stderr,"bookSize:%d\n",(ulong)uStack_230);
    UCT::UCT(&local_235);
    for (tmpBoard.nowPlayer = 0; pFVar1 = _stderr, tmpBoard.nowPlayer < (int)uStack_230;
        tmpBoard.nowPlayer = tmpBoard.nowPlayer + 1) {
      Board::Board((Board *)&my);
      std::istream::read((char *)&local_220,(long)&op);
      std::istream::read((char *)&local_220,(long)&I);
      tmpBoard.board = op | _I;
      tmpBoard.direction[7].row = (undefined4)op;
      tmpBoard.direction[7].col = op._4_4_;
      Board::countBoard((Board *)local_2c4);
      std::tie<std::_Swallow_assign_const,int,int>
                ((tuple<const_std::_Swallow_assign_&,_int_&,_int_&> *)&j,
                 (_Swallow_assign *)&std::ignore,(int *)(local_2c4 + 0x10),(int *)(local_2c4 + 0xc))
      ;
      std::tuple<std::_Swallow_assign_const&,int&,int&>::operator=
                ((tuple<std::_Swallow_assign_const&,int&,int&> *)&j,
                 (tuple<bool,_int,_int> *)local_2c4);
      std::istream::read((char *)&local_220,(long)&black + 2);
      row._3_1_ = 0;
      for (col = 0; col < black._2_1_; col = col + 1) {
        tmpBoard.board = op | _I;
        tmpBoard.direction[7].row = (undefined4)op;
        tmpBoard.direction[7].col = op._4_4_;
        std::istream::read((char *)&local_220,(long)&black + 3);
        std::istream::read((char *)&local_220,(long)&white);
        iVar8 = (int)black._3_1_;
        if (black._3_1_ < '\0') {
          iVar8 = black._3_1_ + 7;
        }
        local_2ec = 7 - (iVar8 >> 3);
        uVar9 = (uint)black._3_1_;
        uVar5 = uVar9;
        if (black._3_1_ < '\0') {
          uVar5 = uVar9 + 7;
        }
        local_2f0 = ((uVar5 & 0xfffffff8) - uVar9) + 7;
        Position::Position(&local_2f8,local_2ec,local_2f0);
        bVar3 = Board::isAbleToChoose((Board *)&my,local_2f8);
        if (!bVar3) {
          fprintf(_stderr,"errror!!!");
          exit(1);
        }
        if (white < -99999) {
          Position::Position(&local_300,local_2ec,local_2f0);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&BadChoose,(key_type *)&my);
          *pmVar6 = local_300;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_308,7 - local_2f0,local_2ec);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&BadChoose,(key_type *)&my);
          *pmVar6 = local_308;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_310,7 - local_2ec,7 - local_2f0);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&BadChoose,(key_type *)&my);
          *pmVar6 = local_310;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_318,local_2f0,7 - local_2ec);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&BadChoose,(key_type *)&my);
          *pmVar6 = local_318;
        }
        else if (((row._3_1_ & 1) == 0) && (0 < white)) {
          Position::Position(&local_320,local_2ec,local_2f0);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&GoodChoose,(key_type *)&my);
          *pmVar6 = local_320;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_328,7 - local_2f0,local_2ec);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&GoodChoose,(key_type *)&my);
          *pmVar6 = local_328;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_330,7 - local_2ec,7 - local_2f0);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&GoodChoose,(key_type *)&my);
          *pmVar6 = local_330;
          Board::turnLeft((Board *)&my);
          Position::Position(&local_338,local_2f0,7 - local_2ec);
          pmVar6 = std::
                   unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
                   ::operator[](&GoodChoose,(key_type *)&my);
          *pmVar6 = local_338;
          row._3_1_ = 1;
        }
      }
    }
    sVar7 = std::
            unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
            ::size(&GoodChoose);
    fprintf(pFVar1,"Good_size:%lu\n",sVar7);
    pFVar1 = _stderr;
    sVar7 = std::
            unordered_map<Board,_Position,_HashFunc,_EqualKey,_std::allocator<std::pair<const_Board,_Position>_>_>
            ::size(&BadChoose);
    fprintf(pFVar1,"Bad_size:%lu\n",sVar7);
    std::ifstream::close();
    i = 1;
    UCT::~UCT(&local_235);
  }
  else {
    fprintf(_stderr,"Opening Book size error !\n");
    std::ifstream::close();
    i = 1;
  }
  std::ifstream::~ifstream(&local_220);
  return true;
}

Assistant:

bool BookChoose::loadBook() {
    std::ifstream in("./book.bin", std::ios::binary | std::ios::in);
    if (!in) {
        fprintf(stderr, "cannot find Opening Book!\n");
    }

    int bookSize;
    in.read((char *) &bookSize, sizeof(bookSize));
    if (!in || bookSize <= 0) {
        fprintf(stderr, "Opening Book size error !\n");
        in.close();
        return true;
    }

    //book = new Book(bookSize * 3 / 2);
    fprintf(stderr,"bookSize:%d\n",bookSize);
    UCT uct;
    for (int i = 0; i < bookSize; i++) {
        Board tmpBoard;
        //BookNode node;
        BitBoard my,op;
        char ch, mov;
        int I;
        in.read((char *) &my, sizeof(my));
        //node.setMy(bb);
        in.read((char *) &op, sizeof(op));
        //node.setOp(bb);
        tmpBoard.used = my|op;
        tmpBoard.board = my;

        //tmpBoard.printBoard();
        //uct.getNextAction(tmpBoard);
        int black,white ;
        tie(ignore,black,white) = tmpBoard.countBoard();
        in.read(&mov, sizeof(mov));
        //node.setMoveCount(ch);
        //printf("mov:%d\n",mov);
        bool hasGood = false;
        for (int j = 0; j < mov; j++) {
            tmpBoard.used = my|op;
            tmpBoard.board = my;
            in.read(&ch, sizeof(ch));
            in.read((char *) &I, sizeof(I));
            int row= 7-ch/8 , col = 7-ch%8;
//
//            int whiteNum,blackNum;
//            tie(ignore, whiteNum, blackNum) = tmpBoard.countBoard();

            if(!tmpBoard.isAbleToChoose(Position(row,col))){
                fprintf(stderr,"errror!!!");
                exit(1);
            }

            if (I<-99999){
                BadChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                BadChoose[tmpBoard]=Position(col,7-row);
                continue;
            }
            if (!hasGood && I>0){
                GoodChoose[tmpBoard]=Position(row,col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-col,row);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(7-row,7-col);
                tmpBoard.turnLeft();
                GoodChoose[tmpBoard]=Position(col,7-row);
                hasGood = true;
                continue;
            }




            //node.setMove(j, ch);
            //node.setEval(j, I);
//        }
//        if (!in) {
//            delete book;
//            book = nullptr;
//            in.close();
//            return false;
//        }
//        book->insert(node);
        }

    }
    fprintf(stderr,"Good_size:%lu\n",GoodChoose.size());
    fprintf(stderr, "Bad_size:%lu\n",BadChoose.size());
    in.close();
    return true;
}